

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_env.c
# Opt level: O1

void gravity_env_free(void)

{
  gravity_class_t *c;
  
  if ((gravity_class_env != (gravity_class_t *)0x0) && (refcount = refcount - 1, refcount == 0)) {
    c = gravity_class_get_meta(gravity_class_env);
    computed_property_free(c,"argc",true);
    computed_property_free(c,"argv",true);
    gravity_class_free_core((gravity_vm *)0x0,c);
    gravity_class_free_core((gravity_vm *)0x0,gravity_class_env);
    gravity_class_env = (gravity_class_t *)0x0;
    return;
  }
  return;
}

Assistant:

void gravity_env_free (void) {
    if (!gravity_class_env) return;
    if (--refcount) return;

    gravity_class_t *meta = gravity_class_get_meta(gravity_class_env);
    computed_property_free(meta, "argc", true);
    computed_property_free(meta, "argv", true);
    gravity_class_free_core(NULL, meta);
    gravity_class_free_core(NULL, gravity_class_env);

    gravity_class_env = NULL;
}